

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O1

compile_errcode __thiscall OutputStatement::Action(OutputStatement *this)

{
  bool bVar1;
  SymbolName SVar2;
  compile_errcode cVar3;
  compile_errcode unaff_EBP;
  int iVar4;
  SymbolType expression_type;
  string str;
  SymbolType local_54;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar4 = 0;
  do {
    SVar2 = SymbolQueue::GetCurrentName(handle_correct_queue);
    switch(iVar4) {
    case 0:
      iVar4 = 1;
      if (SVar2 == PRINTF_SYM) break;
      iVar4 = 0;
LAB_0013164e:
      unaff_EBP = -1;
      bVar1 = false;
      goto LAB_00131651;
    case 1:
      iVar4 = 2;
      if (SVar2 != L_CIRCLE_BRACKET_SYM) {
        iVar4 = 1;
        goto LAB_0013164e;
      }
      break;
    case 2:
      if (SVar2 != STRING_SYM) {
        cVar3 = Expression::Action(&this->m_expression,&local_54);
        if (cVar3 == 0) goto LAB_0013161e;
        iVar4 = 2;
        goto LAB_0013164e;
      }
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"This is a string","");
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      iVar4 = 3;
      break;
    case 3:
      if (SVar2 == COMMA_SYM) {
        iVar4 = 4;
      }
      else {
        if (SVar2 != R_CIRCLE_BRACKET_SYM) {
          iVar4 = 3;
          goto LAB_0013164e;
        }
        iVar4 = 6;
      }
      break;
    case 4:
      cVar3 = Expression::Action(&this->m_expression,&local_54);
      if (cVar3 != 0) {
        iVar4 = 4;
        goto LAB_0013164e;
      }
LAB_0013161e:
      iVar4 = 5;
      break;
    case 5:
      iVar4 = 6;
      if (SVar2 != R_CIRCLE_BRACKET_SYM) {
        iVar4 = 5;
        goto LAB_0013164e;
      }
      break;
    case 6:
      bVar1 = false;
      unaff_EBP = 0;
      goto LAB_00131651;
    }
    bVar1 = true;
    if (iVar4 != 5) {
      SymbolQueue::NextSymbol(handle_correct_queue);
    }
LAB_00131651:
    if (!bVar1) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

compile_errcode OutputStatement::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    SymbolType expression_type;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == PRINTF_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == STRING_SYM) {
                    string str("This is a string");
                    state = 3;
                    break;
                } else if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    state = 5;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == COMMA_SYM) {
                    state = 4;
                    break;
                } else if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 6;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 4: {
                if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    state = 5;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 5: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 6;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 6: return COMPILE_OK;
        }
        if (state != 5)
            handle_correct_queue->NextSymbol();
    }
}